

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O2

int __thiscall DIS::AggregateStatePdu::getMarshalledSize(AggregateStatePdu *this)

{
  pointer pAVar1;
  pointer pEVar2;
  pointer pEVar3;
  pointer pVVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  unsigned_long_long idx;
  ulong uVar15;
  AggregateID listElement;
  
  iVar5 = EntityManagementFamilyPdu::getMarshalledSize(&this->super_EntityManagementFamilyPdu);
  iVar6 = EntityID::getMarshalledSize(&this->_aggregateID);
  iVar7 = EntityType::getMarshalledSize(&this->_aggregateType);
  iVar8 = AggregateMarking::getMarshalledSize(&this->_aggregateMarking);
  iVar9 = Vector3Float::getMarshalledSize(&this->_dimensions);
  iVar10 = Orientation::getMarshalledSize(&this->_orientation);
  iVar11 = Vector3Double::getMarshalledSize(&this->_centerOfMass);
  iVar12 = Vector3Float::getMarshalledSize(&this->_velocity);
  iVar5 = iVar10 + iVar9 + iVar11 + iVar8 + iVar7 + iVar6 + iVar5 + iVar12 + 0xe;
  lVar14 = 8;
  for (uVar15 = 0;
      pAVar1 = (this->_aggregateIDList).
               super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(this->_aggregateIDList).
                             super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 4);
      uVar15 = uVar15 + 1) {
    listElement._vptr_AggregateID = (_func_int **)&PTR__AggregateID_001b0338;
    listElement._aggregateID = *(undefined2 *)((long)&pAVar1->_vptr_AggregateID + lVar14 + 4);
    listElement._8_4_ = *(undefined4 *)((long)&pAVar1->_vptr_AggregateID + lVar14);
    iVar6 = AggregateID::getMarshalledSize(&listElement);
    iVar5 = iVar5 + iVar6;
    AggregateID::~AggregateID(&listElement);
    lVar14 = lVar14 + 0x10;
  }
  lVar14 = 8;
  for (uVar15 = 0;
      pEVar2 = (this->_entityIDList).
               super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(this->_entityIDList).
                             super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 4);
      uVar15 = uVar15 + 1) {
    listElement._vptr_AggregateID = (_func_int **)&PTR__EntityID_001b0cb8;
    listElement._aggregateID = *(undefined2 *)((long)&pEVar2->_vptr_EntityID + lVar14 + 4);
    listElement._8_4_ = *(undefined4 *)((long)&pEVar2->_vptr_EntityID + lVar14);
    iVar6 = EntityID::getMarshalledSize((EntityID *)&listElement);
    iVar5 = iVar5 + iVar6;
    EntityID::~EntityID((EntityID *)&listElement);
    lVar14 = lVar14 + 0x10;
  }
  iVar5 = iVar5 + 1;
  lVar14 = 8;
  for (uVar15 = 0;
      pEVar3 = (this->_silentAggregateSystemList).
               super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(this->_silentAggregateSystemList).
                             super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >> 4);
      uVar15 = uVar15 + 1) {
    listElement._vptr_AggregateID = (_func_int **)&PTR__EntityType_001b0e40;
    listElement._8_8_ = *(undefined8 *)((long)&pEVar3->_vptr_EntityType + lVar14);
    iVar6 = EntityType::getMarshalledSize((EntityType *)&listElement);
    iVar5 = iVar5 + iVar6;
    EntityType::~EntityType((EntityType *)&listElement);
    lVar14 = lVar14 + 0x10;
  }
  lVar14 = 8;
  for (uVar15 = 0;
      pEVar3 = (this->_silentEntitySystemList).
               super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(this->_silentEntitySystemList).
                             super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >> 4);
      uVar15 = uVar15 + 1) {
    listElement._vptr_AggregateID = (_func_int **)&PTR__EntityType_001b0e40;
    listElement._8_8_ = *(undefined8 *)((long)&pEVar3->_vptr_EntityType + lVar14);
    iVar6 = EntityType::getMarshalledSize((EntityType *)&listElement);
    iVar5 = iVar5 + iVar6;
    EntityType::~EntityType((EntityType *)&listElement);
    lVar14 = lVar14 + 0x10;
  }
  iVar5 = iVar5 + 4;
  lVar14 = 0;
  for (uVar15 = 0;
      pVVar4 = (this->_variableDatumList).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar15 < (ulong)(((long)(this->_variableDatumList).
                              super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4) / 0x30);
      uVar15 = uVar15 + 1) {
    VariableDatum::VariableDatum
              ((VariableDatum *)&listElement,
               (VariableDatum *)((long)&pVVar4->_vptr_VariableDatum + lVar14));
    uVar13 = VariableDatum::getMarshalledSize((VariableDatum *)&listElement);
    iVar5 = iVar5 + uVar13;
    VariableDatum::~VariableDatum((VariableDatum *)&listElement);
    lVar14 = lVar14 + 0x30;
  }
  return iVar5;
}

Assistant:

int AggregateStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = EntityManagementFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _aggregateID.getMarshalledSize();  // _aggregateID
   marshalSize = marshalSize + 1;  // _forceID
   marshalSize = marshalSize + 1;  // _aggregateState
   marshalSize = marshalSize + _aggregateType.getMarshalledSize();  // _aggregateType
   marshalSize = marshalSize + 4;  // _formation
   marshalSize = marshalSize + _aggregateMarking.getMarshalledSize();  // _aggregateMarking
   marshalSize = marshalSize + _dimensions.getMarshalledSize();  // _dimensions
   marshalSize = marshalSize + _orientation.getMarshalledSize();  // _orientation
   marshalSize = marshalSize + _centerOfMass.getMarshalledSize();  // _centerOfMass
   marshalSize = marshalSize + _velocity.getMarshalledSize();  // _velocity
   marshalSize = marshalSize + 2;  // _numberOfDisAggregates
   marshalSize = marshalSize + 2;  // _numberOfDisEntities
   marshalSize = marshalSize + 2;  // _numberOfSilentAggregateTypes
   marshalSize = marshalSize + 2;  // _numberOfSilentEntityTypes

   for(unsigned long long idx=0; idx < _aggregateIDList.size(); idx++)
   {
        AggregateID listElement = _aggregateIDList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _entityIDList.size(); idx++)
   {
        EntityID listElement = _entityIDList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

   marshalSize = marshalSize + 1;  // _pad2

   for(unsigned long long idx=0; idx < _silentAggregateSystemList.size(); idx++)
   {
        EntityType listElement = _silentAggregateSystemList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _silentEntitySystemList.size(); idx++)
   {
        EntityType listElement = _silentEntitySystemList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

   marshalSize = marshalSize + 4;  // _numberOfVariableDatumRecords

   for(unsigned long long idx=0; idx < _variableDatumList.size(); idx++)
   {
        VariableDatum listElement = _variableDatumList[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}